

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManProfilePrintOne(Gia_Man_t *p,int i,Vec_Int_t *vArray)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj;
  uint uVar5;
  
  pObj = Gia_ManObj(p,i);
  iVar1 = Gia_ObjIsRi(p,pObj);
  if (iVar1 != 0) {
    return;
  }
  iVar2 = Gia_ObjIsRo(p,pObj);
  iVar1 = 1;
  iVar3 = 1;
  if (iVar2 == 0) {
    iVar3 = Gia_ObjFaninNum(p,pObj);
  }
  iVar2 = Gia_ObjFanoutNum(p,pObj);
  printf("%6d : ");
  for (; iVar1 - iVar3 != 1; iVar1 = iVar1 + 1) {
    Vec_IntEntry(vArray,iVar1);
    printf("  %5s");
  }
  for (iVar1 = iVar3 + -3; iVar1 != 0; iVar1 = iVar1 + 1) {
    printf("  %5s");
  }
  printf("  ->");
  iVar1 = Vec_IntEntry(vArray,0);
  printf(" %5s",GIA_TYPE_STRINGS[iVar1]);
  printf("  ->");
  if (0 < iVar2) {
    iVar1 = Vec_IntEntry(vArray,iVar3 + 1);
    iVar3 = iVar3 + 2;
    uVar5 = 1;
    while( true ) {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
      iVar4 = Vec_IntEntry(vArray,iVar3);
      if (iVar1 != iVar4) {
        printf("  %d x %s",(ulong)uVar5,GIA_TYPE_STRINGS[iVar1]);
        iVar1 = Vec_IntEntry(vArray,iVar3);
        uVar5 = 0;
      }
      uVar5 = uVar5 + 1;
      iVar3 = iVar3 + 1;
    }
    printf("  %d x %s",(ulong)uVar5,GIA_TYPE_STRINGS[iVar1]);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManProfilePrintOne( Gia_Man_t * p, int i, Vec_Int_t * vArray )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, i );
    int k, nFanins, nFanouts;
    if ( Gia_ObjIsRi(p, pObj) )
        return;
    nFanins = Gia_ObjIsRo(p, pObj) ? 1 : Gia_ObjFaninNum(p, pObj);
    nFanouts = Gia_ObjFanoutNum(p, pObj);

    printf( "%6d : ", i );
    for ( k = 0; k < nFanins; k++ )
        printf( "  %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, k + 1)] );
    for (      ; k < 3; k++ )
        printf( "  %5s", "" );
    printf( "  ->" );
    printf( " %5s", GIA_TYPE_STRINGS[Vec_IntEntry(vArray, 0)] );
    printf( "  ->" );
    if ( nFanouts > 0 )
    {
        int Count = 1, Prev = Vec_IntEntry(vArray, 1 + nFanins);
        for ( k = 1; k < nFanouts; k++ )
        {
            if ( Prev != Vec_IntEntry(vArray, k + 1 + nFanins) )
            {
                printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
                Prev = Vec_IntEntry(vArray, k + 1 + nFanins);
                Count = 0;
            }
            Count++;
        }
        printf( "  %d x %s", Count, GIA_TYPE_STRINGS[Prev] );
    }
    printf( "\n" );
}